

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O1

MPP_RET mpp_frame_copy(MppFrame dst,MppFrame src)

{
  MPP_RET MVar1;
  
  if ((dst == (MppFrame)0x0) || (MVar1 = _check_is_mpp_frame("mpp_frame_copy",src), MVar1 != MPP_OK)
     ) {
    _mpp_log_l(2,"mpp_frame","invalid input dst %p src %p\n","mpp_frame_copy",dst,src);
    return MPP_ERR_UNKNOW;
  }
  if (*(MppMeta *)((long)dst + 0xb0) != (MppMeta)0x0) {
    mpp_meta_put(*(MppMeta *)((long)dst + 0xb0));
  }
  memcpy(dst,src,0xe0);
  if (*(MppMeta *)((long)src + 0xb0) == (MppMeta)0x0) {
    return MPP_OK;
  }
  mpp_meta_inc_ref(*(MppMeta *)((long)src + 0xb0));
  return MPP_OK;
}

Assistant:

MPP_RET mpp_frame_copy(MppFrame dst, MppFrame src)
{
    if (NULL == dst || check_is_mpp_frame(src)) {
        mpp_err_f("invalid input dst %p src %p\n", dst, src);
        return MPP_ERR_UNKNOW;
    }

    MppFrameImpl *p = (MppFrameImpl *)dst;
    if (p->meta)
        mpp_meta_put(p->meta);

    memcpy(dst, src, sizeof(MppFrameImpl));
    p = (MppFrameImpl *)src;
    if (p->meta)
        mpp_meta_inc_ref(p->meta);

    return MPP_OK;
}